

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int meatobj(monst *mtmp)

{
  obj *poVar1;
  obj *obj;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  obj *otmp3;
  char buf [256];
  int local_40;
  int ecount;
  int count;
  int heal;
  int grow;
  int poly;
  permonst *ptr;
  obj *otmp2;
  obj *otmp;
  monst *mtmp_local;
  
  local_40 = 0;
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  otmp3._0_1_ = '\0';
  if (mtmp->mtame == '\0') {
    poVar1 = level->objects[mtmp->mx][mtmp->my];
LAB_00247d1e:
    otmp2 = poVar1;
    if (otmp2 != (obj *)0x0) {
      poVar1 = (otmp2->v).v_nexthere;
      if ((((*(ushort *)&objects[otmp2->otyp].field_0x11 >> 4 & 0x1f) < 9) &&
          (bVar2 = obj_resists(otmp2,5,0x5f), bVar2 == '\0')) &&
         (iVar3 = touch_artifact(otmp2,mtmp), iVar3 != 0)) goto code_r0x00247d98;
      if ((((otmp2->oclass != '\x0e') && (otmp2 != uball)) && (otmp2 != uchain)) &&
         ((((*(uint *)&otmp2->field_0x4a >> 0xd & 1) == 0 || (otmp2->otyp == 0xda)) ||
          ((otmp2->otyp == 0xdb || (otmp2->otyp == 0xdc)))))) {
        buf._252_4_ = buf._252_4_ + 1;
        if (buf._252_4_ == 1) {
          pcVar4 = Monnam(mtmp);
          pcVar5 = distant_name(otmp2,doname);
          sprintf((char *)&otmp3,"%s engulfs %s.",pcVar4,pcVar5);
        }
        else if (buf._252_4_ == 2) {
          pcVar4 = Monnam(mtmp);
          sprintf((char *)&otmp3,"%s engulfs several objects.",pcVar4);
        }
        obj_extract_self(otmp2);
        mpickobj(mtmp,otmp2);
      }
      goto LAB_002482fa;
    }
    if (0 < (int)buf._252_4_) {
      if ((((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) || (flags.verbose == '\0')) ||
         ((char)otmp3 == '\0')) {
        if ((flags.soundok != '\0') && (flags.verbose != '\0')) {
          pcVar4 = "several";
          if (buf._252_4_ == 1) {
            pcVar4 = "a";
          }
          pcVar5 = "s";
          if (buf._252_4_ == 1) {
            pcVar5 = "";
          }
          You_hear("%s slurping sound%s.",pcVar4,pcVar5);
        }
      }
      else {
        pline("%s",&otmp3);
      }
    }
    mtmp_local._4_4_ = (uint)(0 < local_40 || 0 < (int)buf._252_4_);
  }
  else {
    mtmp_local._4_4_ = 0;
  }
  return mtmp_local._4_4_;
code_r0x00247d98:
  if ((((otmp2->otyp != 0x10e) ||
       ((((long)otmp2->corpsenm & 0x3ffffffffffffffU) != 0xc &&
        (((long)otmp2->corpsenm & 0x3ffffffffffffffU) != 0xb)))) ||
      ((mtmp->mintrinsics & 0x80) != 0)) &&
     (((otmp2->otyp != 0xcb && (otmp2->otyp != 0xb4)) &&
      (((*(uint *)&otmp2->field_0x4a >> 0xd & 1) == 0 ||
       (((otmp2->otyp == 0xda || (otmp2->otyp == 0xdb)) || (otmp2->otyp == 0xdc)))))))) {
    local_40 = local_40 + 1;
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) || (flags.verbose == '\0')) {
      if ((flags.soundok != '\0') && (flags.verbose != '\0')) {
        You_hear("a slurping sound.");
      }
    }
    else {
      pcVar4 = Monnam(mtmp);
      pcVar5 = distant_name(otmp2,doname);
      pline("%s eats %s!",pcVar4,pcVar5);
    }
    if ((mtmp->mhp < mtmp->mhpmax) &&
       (mtmp->mhp = (uint)objects[otmp2->otyp].oc_weight + mtmp->mhp, mtmp->mhpmax < mtmp->mhp)) {
      mtmp->mhp = mtmp->mhpmax;
    }
    if (otmp2->cobj != (obj *)0x0) {
      while (obj = otmp2->cobj, obj != (obj *)0x0) {
        obj_extract_self(obj);
        if ((otmp2->otyp == 0xdd) && (obj->otyp == 0x10e)) {
          obj->age = moves - obj->age;
          start_corpse_timeout(obj);
        }
        mpickobj(mtmp,obj);
      }
    }
    if (((otmp2->otyp == 0x10e) || (otmp2->otyp == 0x10f)) || (bVar6 = false, otmp2->otyp == 0x129))
    {
      iVar3 = pm_to_cham(otmp2->corpsenm);
      bVar6 = iVar3 != 0;
    }
    if (((otmp2->otyp == 0x10e) || (otmp2->otyp == 0x10f)) || (bVar7 = false, otmp2->otyp == 0x129))
    {
      bVar7 = otmp2->corpsenm == 0xec;
    }
    if (((otmp2->otyp == 0x10e) || (otmp2->otyp == 0x10f)) || (bVar8 = false, otmp2->otyp == 0x129))
    {
      bVar8 = otmp2->corpsenm == 0x119;
    }
    delobj(otmp2);
    _grow = mtmp->data;
    if (bVar6) {
      iVar3 = newcham(level,mtmp,(permonst *)0x0,'\0','\0');
      if (iVar3 != 0) {
        _grow = mtmp->data;
      }
    }
    else if (bVar7) {
      _grow = grow_up(mtmp,(monst *)0x0);
    }
    else if (bVar8) {
      mtmp->mhp = mtmp->mhpmax;
    }
    if (_grow != mons + 10) {
      if (_grow != (permonst *)0x0) {
        return 1;
      }
      return 2;
    }
LAB_002482fa:
    if ((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) {
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
  }
  goto LAB_00247d1e;
}

Assistant:

int meatobj(struct monst *mtmp)
{
	struct obj *otmp, *otmp2;
	const struct permonst *ptr;
	int poly, grow, heal, count = 0, ecount = 0;
	char buf[BUFSZ];

	buf[0] = '\0';
	/* If a pet, eating is handled separately, in dog.c */
	if (mtmp->mtame) return 0;

	/* Eats organic objects, including cloth and wood, if there */
	/* Engulfs others, except huge rocks and metal attached to player */
	for (otmp = level->objects[mtmp->mx][mtmp->my]; otmp; otmp = otmp2) {
	    otmp2 = otmp->nexthere;
	    if (is_organic(otmp) && !obj_resists(otmp, 5, 95) &&
		    touch_artifact(otmp,mtmp)) {
		if (otmp->otyp == CORPSE && touch_petrifies(&mons[otmp->corpsenm]) &&
			!resists_ston(mtmp))
		    continue;
		if (otmp->otyp == AMULET_OF_STRANGULATION ||
				otmp->otyp == RIN_SLOW_DIGESTION)
		    continue;
		if (Is_prize(otmp))
		    continue;
		++count;
		if (cansee(mtmp->mx,mtmp->my) && flags.verbose)
		    pline("%s eats %s!", Monnam(mtmp),
			    distant_name(otmp, doname));
		else if (flags.soundok && flags.verbose)
		    You_hear("a slurping sound.");
		/* Heal up to the object's weight in hp */
		if (mtmp->mhp < mtmp->mhpmax) {
		    mtmp->mhp += objects[otmp->otyp].oc_weight;
		    if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;
		}
		if (Has_contents(otmp)) {
		    struct obj *otmp3;
		    /* contents of eaten containers become engulfed; this
		       is arbitrary, but otherwise g.cubes are too powerful */
		    while ((otmp3 = otmp->cobj) != 0) {
			obj_extract_self(otmp3);
			if (otmp->otyp == ICE_BOX && otmp3->otyp == CORPSE) {
			    otmp3->age = moves - otmp3->age;
			    start_corpse_timeout(otmp3);
			}
			mpickobj(mtmp, otmp3);
		    }
		}
		poly = polyfodder(otmp);
		grow = mlevelgain(otmp);
		heal = mhealup(otmp);
		delobj(otmp);		/* munch */
		ptr = mtmp->data;
		if (poly) {
		    if (newcham(level, mtmp, NULL, FALSE, FALSE))
			ptr = mtmp->data;
		} else if (grow) {
		    ptr = grow_up(mtmp, NULL);
		} else if (heal) {
		    mtmp->mhp = mtmp->mhpmax;
		}
		/* in case it polymorphed or died */
		if (ptr != &mons[PM_GELATINOUS_CUBE])
		    return !ptr ? 2 : 1;
	    } else if (otmp->oclass != ROCK_CLASS &&
		       otmp != uball && otmp != uchain &&
		       !Is_prize(otmp)) {
		++ecount;
		if (ecount == 1) {
			sprintf(buf, "%s engulfs %s.", Monnam(mtmp),
			    distant_name(otmp,doname));
		} else if (ecount == 2)
			sprintf(buf, "%s engulfs several objects.", Monnam(mtmp));
		obj_extract_self(otmp);
		mpickobj(mtmp, otmp);	/* slurp */
	    }
	    /* Engulf & devour is instant, so don't set meating */
	    if (mtmp->minvis) newsym(mtmp->mx, mtmp->my);
	}
	if (ecount > 0) {
	    if (cansee(mtmp->mx, mtmp->my) && flags.verbose && buf[0])
		pline("%s", buf);
	    else if (flags.soundok && flags.verbose)
	    	You_hear("%s slurping sound%s.",
			ecount == 1 ? "a" : "several",
			ecount == 1 ? "" : "s");
	}
	return ((count > 0) || (ecount > 0)) ? 1 : 0;
}